

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O0

uint efsw::Platform::System::sleep(uint __seconds)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  undefined1 local_90 [8];
  pthread_cond_t condition;
  pthread_mutex_t mutex;
  timespec ti;
  timeval tv;
  unsigned_long_long usecs;
  unsigned_long *ms_local;
  
  uVar2 = *(long *)CONCAT44(in_register_0000003c,__seconds) * 1000;
  gettimeofday((timeval *)&ti.tv_nsec,(__timezone_ptr_t)0x0);
  lVar3 = (tv.tv_sec + uVar2 % 1000000) * 1000;
  mutex.__data.__list.__next =
       (__pthread_internal_list *)(ti.tv_nsec + uVar2 / 1000000 + lVar3 / 1000000000);
  ti.tv_sec = lVar3 % 1000000000;
  pthread_mutex_init((pthread_mutex_t *)condition.__data.__g_signals,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)local_90,(pthread_condattr_t *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)condition.__data.__g_signals);
  pthread_cond_timedwait
            ((pthread_cond_t *)local_90,(pthread_mutex_t *)condition.__data.__g_signals,
             (timespec *)&mutex.__data.__list.__next);
  pthread_mutex_unlock((pthread_mutex_t *)condition.__data.__g_signals);
  uVar1 = pthread_cond_destroy((pthread_cond_t *)local_90);
  return uVar1;
}

Assistant:

void System::sleep( const unsigned long& ms ) {
	// usleep( static_cast<unsigned long>( ms * 1000 ) );

	// usleep is not reliable enough (it might block the
	// whole process instead of just the current thread)
	// so we must use pthread_cond_timedwait instead

	// this implementation is inspired from Qt
	// and taken from SFML

	unsigned long long usecs = ms * 1000;

	// get the current time
	timeval tv;
	gettimeofday( &tv, NULL );

	// construct the time limit (current time + time to wait)
	timespec ti;
	ti.tv_nsec = ( tv.tv_usec + ( usecs % 1000000 ) ) * 1000;
	ti.tv_sec = tv.tv_sec + ( usecs / 1000000 ) + ( ti.tv_nsec / 1000000000 );
	ti.tv_nsec %= 1000000000;

	// create a mutex and thread condition
	pthread_mutex_t mutex;
	pthread_mutex_init( &mutex, 0 );
	pthread_cond_t condition;
	pthread_cond_init( &condition, 0 );

	// wait...
	pthread_mutex_lock( &mutex );
	pthread_cond_timedwait( &condition, &mutex, &ti );
	pthread_mutex_unlock( &mutex );

	// destroy the mutex and condition
	pthread_cond_destroy( &condition );
}